

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * sym_RedefEqu(char *symName,int32_t value)

{
  bool bVar1;
  Symbol *sym;
  int32_t value_local;
  char *symName_local;
  
  symName_local = sym_FindExactSymbol(symName)->name;
  if ((Symbol *)symName_local == (Symbol *)0x0) {
    symName_local = sym_AddEqu(symName,value)->name;
  }
  else {
    bVar1 = sym_IsDefined((Symbol *)symName_local);
    if ((bVar1) && (((Symbol *)symName_local)->type != SYM_EQU)) {
      error("\'%s\' already defined as non-EQU at ",symName);
      dumpFilename((Symbol *)symName_local);
      putc(10,_stderr);
      symName_local = (char *)0x0;
    }
    else if ((((Symbol *)symName_local)->isBuiltin & 1U) == 0) {
      updateSymbolFilename((Symbol *)symName_local);
      ((Symbol *)symName_local)->type = SYM_EQU;
      (((Symbol *)symName_local)->field_8).value = value;
    }
    else {
      error("Built-in symbol \'%s\' cannot be redefined\n",symName);
      symName_local = (char *)0x0;
    }
  }
  return (Symbol *)symName_local;
}

Assistant:

struct Symbol *sym_RedefEqu(char const *symName, int32_t value)
{
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym)
		return sym_AddEqu(symName, value);

	if (sym_IsDefined(sym) && sym->type != SYM_EQU) {
		error("'%s' already defined as non-EQU at ", symName);
		dumpFilename(sym);
		putc('\n', stderr);
		return NULL;
	} else if (sym->isBuiltin) {
		error("Built-in symbol '%s' cannot be redefined\n", symName);
		return NULL;
	}

	updateSymbolFilename(sym);
	sym->type = SYM_EQU;
	sym->value = value;

	return sym;
}